

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::
MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
::SetUp(MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
        *this)

{
  uint8_t **val1;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _func_void_uchar_ptr_int_uchar_ptr_int_uint_ptr_int_ptr_uint_ptr_int_ptr_uint_ptr *p_Var4;
  undefined8 uVar5;
  undefined8 *puVar6;
  bool bVar7;
  uint8_t *puVar8;
  SEARCH_METHODS *pSVar9;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  GTestLog local_38 [2];
  undefined8 *local_30;
  
  bVar7 = testing::internal::IsTrue
                    (testing::
                     WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
                     ::parameter_ != (undefined8 *)0x0);
  if (!bVar7) {
    testing::internal::GTestLog::GTestLog
              (local_38,GTEST_FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/gtest.h"
               ,0x67d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition parameter_ != nullptr failed. ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "GetParam() can only be called inside a value-parameterized test ",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"-- did you intend to write TEST_P instead of TEST_F?",0x34);
    testing::internal::GTestLog::~GTestLog(local_38);
  }
  uVar1 = *testing::
           WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
           ::parameter_;
  uVar2 = testing::
          WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
          ::parameter_[1];
  uVar3 = testing::
          WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
          ::parameter_[2];
  p_Var4 = (_func_void_uchar_ptr_int_uchar_ptr_int_uint_ptr_int_ptr_uint_ptr_int_ptr_uint_ptr *)
           testing::
           WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
           ::parameter_[3];
  uVar5 = *(undefined8 *)
           ((long)testing::
                  WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
                  ::parameter_ + 0x24);
  *(undefined8 *)((long)&(this->params_).func + 4) =
       *(undefined8 *)
        ((long)testing::
               WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
               ::parameter_ + 0x1c);
  (this->params_).use_high_bit_depth = (bool)(char)uVar5;
  *(int3 *)&(this->params_).field_0x25 = (int3)((ulong)uVar5 >> 8);
  (this->params_).mask = (int)((ulong)uVar5 >> 0x20);
  *(undefined8 *)&(this->params_).block_size = uVar3;
  (this->params_).func = p_Var4;
  (this->params_).log2width = (int)uVar1;
  (this->params_).log2height = (int)((ulong)uVar1 >> 0x20);
  (this->params_).width = (int)uVar2;
  (this->params_).height = (int)((ulong)uVar2 >> 0x20);
  (this->rnd_).random_.state_ = 0xbaba;
  bVar7 = (this->params_).use_high_bit_depth;
  puVar8 = (uint8_t *)aom_memalign(0x10,(long)(this->params_).block_size << (bVar7 & 0x3fU));
  val1 = &this->src_;
  this->src_ = puVar8;
  puVar8 = (uint8_t *)operator_new__((long)(this->params_).block_size << (bVar7 & 0x3fU));
  this->ref_ = puVar8;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            ((internal *)local_38,"src_","nullptr",val1,&local_48._M_head_impl);
  puVar6 = local_30;
  if ((internal)(undefined1)local_38[0].severity_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (undefined8 *)0x0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = (SEARCH_METHODS *)*local_30;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x262,(char *)pSVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
  }
  else {
    if (local_30 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_30 != local_30 + 2) {
        operator_delete((undefined8 *)*local_30);
      }
      operator_delete(puVar6);
    }
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              ((internal *)local_38,"ref_","nullptr",&this->ref_,&local_48._M_head_impl);
    if ((internal)(undefined1)local_38[0].severity_ != (internal)0x0) {
      if (local_30 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_30 != local_30 + 2) {
          operator_delete((undefined8 *)*local_30);
        }
        operator_delete(local_30);
      }
      memset(this->src_,0,(long)(this->params_).block_size);
      memset(this->ref_,0,(long)(this->params_).block_size);
      if ((this->params_).use_high_bit_depth != true) {
        return;
      }
      *val1 = (uint8_t *)((ulong)*val1 >> 1);
      this->ref_ = (uint8_t *)((ulong)this->ref_ >> 1);
      return;
    }
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (undefined8 *)0x0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = (SEARCH_METHODS *)*local_30;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x263,(char *)pSVar9);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  if (local_30 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_30 != local_30 + 2) {
      operator_delete((undefined8 *)*local_30);
    }
    operator_delete(local_30);
  }
  return;
}

Assistant:

void SetUp() override {
    params_ = this->GetParam();

    rnd_.Reset(ACMRandom::DeterministicSeed());
    const size_t unit =
        use_high_bit_depth() ? sizeof(uint16_t) : sizeof(uint8_t);
    src_ = reinterpret_cast<uint8_t *>(aom_memalign(16, block_size() * unit));
    ref_ = new uint8_t[block_size() * unit];
    ASSERT_NE(src_, nullptr);
    ASSERT_NE(ref_, nullptr);
    memset(src_, 0, block_size() * sizeof(src_[0]));
    memset(ref_, 0, block_size() * sizeof(ref_[0]));
    if (use_high_bit_depth()) {
      // TODO(skal): remove!
      src_ = CONVERT_TO_BYTEPTR(src_);
      ref_ = CONVERT_TO_BYTEPTR(ref_);
    }
  }